

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void see_floor_items(game_event_type type,game_event_data *data,void *user)

{
  ushort uVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t floor_num_00;
  object **items;
  char *str;
  ui_event uVar4;
  _Bool local_d1;
  ui_event_type local_c8;
  undefined1 local_b4 [8];
  ui_event e;
  char o_name [80];
  object *obj;
  wchar_t i;
  _Bool can_pickup;
  char *p;
  _Bool blind;
  wchar_t floor_num;
  object **floor_list;
  wchar_t floor_max;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  uVar1 = z_info->floor_size;
  items = (object **)mem_zalloc((long)(int)(uint)uVar1 << 3);
  local_d1 = true;
  if (player->timed[2] == 0) {
    local_d1 = no_light(player);
  }
  _i = "see";
  bVar2 = false;
  floor_num_00 = scan_floor(items,(uint)uVar1,player,OFLOOR_VISIBLE|OFLOOR_SENSE,(item_tester)0x0);
  if (floor_num_00 == L'\0') {
    mem_free(items);
  }
  else {
    for (obj._0_4_ = L'\0'; (wchar_t)obj < floor_num_00; obj._0_4_ = (wchar_t)obj + L'\x01') {
      _Var3 = inven_carry_okay(items[(wchar_t)obj]);
      if (_Var3) {
        bVar2 = true;
      }
    }
    if (floor_num_00 == L'\x01') {
      if (bVar2) {
        if (local_d1 != false) {
          _i = "feel";
        }
      }
      else {
        _i = "have no room for";
      }
      if (local_d1 == false) {
        object_desc((char *)&e.mouse.x,0x50,*items,0x43,player);
      }
      else {
        object_desc((char *)&e.mouse.x,0x50,*items,0x40,player);
      }
      event_signal(EVENT_MESSAGE_FLUSH);
      msg("You %s %s.",_i,&e.mouse.x);
    }
    else {
      if (bVar2) {
        if (local_d1 != false) {
          _i = "feel something on the floor";
        }
      }
      else {
        _i = "have no room for the following objects";
      }
      screen_save();
      show_floor(items,floor_num_00,L'\b',(item_tester)0x0);
      str = format("You %s: ",_i);
      prt(str,L'\0',L'\0');
      uVar4 = inkey_ex();
      local_b4 = (undefined1  [8])uVar4.mouse;
      local_c8 = CONCAT31(local_c8._1_3_,uVar4.key.mods);
      e.type = local_c8;
      Term_event_push((ui_event *)local_b4);
      screen_load();
    }
    mem_free(items);
  }
  return;
}

Assistant:

static void see_floor_items(game_event_type type, game_event_data *data,
							void *user)
{
	int floor_max = z_info->floor_size;
	struct object **floor_list = mem_zalloc(floor_max * sizeof(*floor_list));
	int floor_num = 0;
	bool blind = ((player->timed[TMD_BLIND]) || (no_light(player)));

	const char *p = "see";
	bool can_pickup = false;
	int i;

	/* Scan all visible, sensed objects in the grid */
	floor_num = scan_floor(floor_list, floor_max, player,
		OFLOOR_SENSE | OFLOOR_VISIBLE, NULL);
	if (floor_num == 0) {
		mem_free(floor_list);
		return;
	}

	/* Can we pick any up? */
	for (i = 0; i < floor_num; i++)
	    if (inven_carry_okay(floor_list[i]))
			can_pickup = true;

	/* One object */
	if (floor_num == 1) {
		/* Get the object */
		struct object *obj = floor_list[0];
		char o_name[80];

		if (!can_pickup)
			p = "have no room for";
		else if (blind)
			p = "feel";

		/* Describe the object.  Less detail if blind. */
		if (blind) {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_BASE, player);
		} else {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, player);
		}

		/* Message */
		event_signal(EVENT_MESSAGE_FLUSH);
		msg("You %s %s.", p, o_name);
	} else {
		ui_event e;

		if (!can_pickup)
			p = "have no room for the following objects";
		else if (blind)
			p = "feel something on the floor";

		/* Display objects on the floor */
		screen_save();
		show_floor(floor_list, floor_num, OLIST_WEIGHT, NULL);
		prt(format("You %s: ", p), 0, 0);

		/* Wait for it.  Use key as next command. */
		e = inkey_ex();
		Term_event_push(&e);

		/* Restore screen */
		screen_load();
	}

	mem_free(floor_list);
}